

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
TasGrid::MultiIndexManipulations::computeTensorWeights
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,MultiIndexSet *mset)

{
  pointer *this;
  pointer *this_00;
  size_t sVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  int local_cc;
  int j;
  int *val;
  int i_1;
  int job;
  int d;
  int i;
  value_type *last_jobs;
  value_type_conflict3 local_a0;
  undefined1 local_99;
  undefined1 local_98 [8];
  Data2D<int> dag_down;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  lines1d;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  map;
  allocator<int> local_29;
  value_type_conflict3 local_28;
  undefined1 local_21;
  int local_20;
  int local_1c;
  int num_tensors;
  int num_dimensions;
  MultiIndexSet *mset_local;
  vector<int,_std::allocator<int>_> *weights;
  
  _num_tensors = mset;
  mset_local = (MultiIndexSet *)__return_storage_ptr__;
  sVar1 = MultiIndexSet::getNumDimensions(mset);
  local_1c = (int)sVar1;
  local_20 = MultiIndexSet::getNumIndexes(_num_tensors);
  if (local_1c == 1) {
    local_21 = 0;
    sVar2 = (size_type)local_20;
    local_28 = 0;
    ::std::allocator<int>::allocator(&local_29);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,sVar2,&local_28,&local_29
              );
    ::std::allocator<int>::~allocator(&local_29);
    pvVar3 = ::std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__);
    *pvVar3 = 1;
  }
  else {
    this = &lines1d.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ::std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)this);
    this_00 = &dag_down.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    ::std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)this_00);
    resortIndexes(_num_tensors,
                  (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)this,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)this_00);
    Data2D<int>::Data2D<int,int>((Data2D<int> *)local_98,local_1c,local_20);
    local_99 = 0;
    sVar2 = (size_type)local_20;
    local_a0 = 0;
    ::std::allocator<int>::allocator((allocator<int> *)((long)&last_jobs + 7));
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,sVar2,&local_a0,
               (allocator<int> *)((long)&last_jobs + 7));
    ::std::allocator<int>::~allocator((allocator<int> *)((long)&last_jobs + 7));
    pvVar4 = ::std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)&dag_down.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(long)(local_1c + -1));
    for (job = 0; sVar2 = ::std::vector<int,_std::allocator<int>_>::size(pvVar4),
        job < (int)sVar2 + -1; job = job + 1) {
      pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)(job + 1));
      pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,
                          (long)(*pvVar5 + -1));
      *pvVar3 = 1;
    }
    for (i_1 = local_1c + -2; -1 < i_1; i_1 = i_1 + -1) {
      val._4_4_ = 0;
      while( true ) {
        pvVar4 = ::std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)&dag_down.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage,(long)i_1);
        sVar2 = ::std::vector<int,_std::allocator<int>_>::size(pvVar4);
        if ((int)sVar2 + -1 <= val._4_4_) break;
        pvVar4 = ::std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)&dag_down.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage,(long)i_1);
        pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)(val._4_4_ + 1));
        val._0_4_ = *pvVar3 + -2;
        while( true ) {
          pvVar4 = ::std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)&dag_down.vec.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,(long)i_1);
          pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)val._4_4_);
          if ((int)val < *pvVar3) break;
          pvVar4 = ::std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)&lines1d.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)i_1);
          pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)(int)val);
          pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,
                              (long)*pvVar3);
          local_cc = (int)val;
          while( true ) {
            local_cc = local_cc + 1;
            pvVar4 = ::std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)&dag_down.vec.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,(long)i_1);
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               (pvVar4,(long)(val._4_4_ + 1));
            if (*pvVar6 <= local_cc) break;
            pvVar4 = ::std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)&lines1d.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)i_1);
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_cc);
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,
                                (long)*pvVar6);
            *pvVar3 = *pvVar3 - *pvVar6;
          }
          val._0_4_ = (int)val + -1;
        }
        val._4_4_ = val._4_4_ + 1;
      }
    }
    local_99 = 1;
    Data2D<int>::~Data2D((Data2D<int> *)local_98);
    ::std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&dag_down.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    ::std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&lines1d.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> computeTensorWeights(MultiIndexSet const &mset){
    int num_dimensions = mset.getNumDimensions();
    int num_tensors = mset.getNumIndexes();

    if (num_dimensions == 1) {
        std::vector<int> weights(num_tensors, 0);
        weights.back() = 1;
        return weights;
    }

    std::vector<std::vector<int>> map;
    std::vector<std::vector<int>> lines1d;

    resortIndexes(mset, map, lines1d);

    Data2D<int> dag_down(num_dimensions, num_tensors);

    std::vector<int> weights(num_tensors, 0);

    // the row with contiguous indexes has a trivial solution
    auto const& last_jobs = lines1d[num_dimensions-1];
    for(int i=0; i<static_cast<int>(last_jobs.size() - 1); i++)
        weights[last_jobs[i+1] - 1] = 1;

    for(int d=num_dimensions-2; d>=0; d--) {
        #pragma omp parallel for
        for(int job = 0; job < static_cast<int>(lines1d[d].size() - 1); job++) {
            for(int i=lines1d[d][job+1]-2; i>=lines1d[d][job]; i--) {
                int &val = weights[map[d][i]];
                for(int j=i+1; j<lines1d[d][job+1]; j++) {
                    val -= weights[map[d][j]];
                }
            }
        }
    }

    return weights;
}